

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicseffect.cpp
# Opt level: O1

void __thiscall QGraphicsEffectSource::draw(QGraphicsEffectSource *this,QPainter *painter)

{
  long lVar1;
  double dVar2;
  char cVar3;
  undefined8 *puVar4;
  long lVar5;
  undefined8 *puVar6;
  undefined8 *puVar7;
  QPixmap *pQVar8;
  long in_FS_OFFSET;
  byte bVar9;
  QTransform restoreTransform;
  undefined1 *local_e8;
  undefined1 *puStack_e0;
  undefined1 *local_d8;
  QPixmap local_c8 [72];
  ushort local_80;
  undefined8 local_78 [9];
  ushort local_30;
  long local_28;
  
  bVar9 = 0;
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)(this + 8);
  local_d8 = &DAT_aaaaaaaaaaaaaaaa;
  local_e8 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_e0 = &DAT_aaaaaaaaaaaaaaaa;
  QPixmap::QPixmap((QPixmap *)&local_e8);
  cVar3 = QPixmapCache::find((Key *)(lVar1 + 0x88),(QPixmap *)&local_e8);
  if (cVar3 == '\0') {
    (**(code **)(**(long **)(this + 8) + 0x50))(*(long **)(this + 8),painter);
  }
  else {
    puVar6 = &DAT_006dc5a0;
    puVar7 = local_78;
    for (lVar5 = 10; lVar5 != 0; lVar5 = lVar5 + -1) {
      *puVar7 = *puVar6;
      puVar6 = puVar6 + (ulong)bVar9 * -2 + 1;
      puVar7 = puVar7 + (ulong)bVar9 * -2 + 1;
    }
    puVar6 = &DAT_006dd1b8;
    puVar7 = local_78;
    for (lVar5 = 9; lVar5 != 0; lVar5 = lVar5 + -1) {
      *puVar7 = *puVar6;
      puVar6 = puVar6 + (ulong)bVar9 * -2 + 1;
      puVar7 = puVar7 + (ulong)bVar9 * -2 + 1;
    }
    local_30 = local_30 & 0xfc00;
    if (*(int *)(lVar1 + 0x78) == 0) {
      puVar4 = (undefined8 *)QPainter::worldTransform();
      puVar6 = puVar4;
      puVar7 = local_78;
      for (lVar5 = 9; lVar5 != 0; lVar5 = lVar5 + -1) {
        *puVar7 = *puVar6;
        puVar6 = puVar6 + (ulong)bVar9 * -2 + 1;
        puVar7 = puVar7 + (ulong)bVar9 * -2 + 1;
      }
      local_30 = *(ushort *)(puVar4 + 9);
      puVar6 = &DAT_006dd1b8;
      pQVar8 = local_c8;
      for (lVar5 = 9; lVar5 != 0; lVar5 = lVar5 + -1) {
        *(undefined8 *)&pQVar8->field_0x0 = *puVar6;
        puVar6 = puVar6 + (ulong)bVar9 * -2 + 1;
        pQVar8 = pQVar8 + (ulong)bVar9 * -0x10 + 8;
      }
      local_80 = local_80 & 0xfc00;
      QPainter::setWorldTransform((QTransform *)painter,SUB81(local_c8,0));
    }
    dVar2 = (double)(int)((ulong)*(undefined8 *)(lVar1 + 0x80) >> 0x20);
    local_c8._8_4_ = SUB84(dVar2,0);
    local_c8._0_8_ = (double)(int)*(undefined8 *)(lVar1 + 0x80);
    local_c8._12_4_ = (int)((ulong)dVar2 >> 0x20);
    QPainter::drawPixmap((QPointF *)painter,local_c8);
    if (*(int *)(lVar1 + 0x78) == 0) {
      QPainter::setWorldTransform((QTransform *)painter,SUB81(local_78,0));
    }
  }
  QPixmap::~QPixmap((QPixmap *)&local_e8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsEffectSource::draw(QPainter *painter)
{
    Q_D(const QGraphicsEffectSource);

    QPixmap pm;
    if (QPixmapCache::find(d->m_cacheKey, &pm)) {
        QTransform restoreTransform;
        if (d->m_cachedSystem == Qt::DeviceCoordinates) {
            restoreTransform = painter->worldTransform();
            painter->setWorldTransform(QTransform());
        }

        painter->drawPixmap(d->m_cachedOffset, pm);

        if (d->m_cachedSystem == Qt::DeviceCoordinates)
            painter->setWorldTransform(restoreTransform);
    } else {
        d_func()->draw(painter);
    }
}